

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<std::pair<QListWidgetItem_*,_int>_>::copyAppend
          (QPodArrayOps<std::pair<QListWidgetItem_*,_int>_> *this,pair<QListWidgetItem_*,_int> *b,
          pair<QListWidgetItem_*,_int> *e)

{
  pair<QListWidgetItem_*,_int> *__dest;
  void *in_RDX;
  void *in_RSI;
  QArrayDataPointer<std::pair<QListWidgetItem_*,_int>_> *in_RDI;
  
  if (in_RSI != in_RDX) {
    __dest = QArrayDataPointer<std::pair<QListWidgetItem_*,_int>_>::end(in_RDI);
    memcpy(__dest,in_RSI,((long)in_RDX - (long)in_RSI >> 4) << 4);
    in_RDI->size = ((long)in_RDX - (long)in_RSI >> 4) + in_RDI->size;
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e) noexcept
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        ::memcpy(static_cast<void *>(this->end()), static_cast<const void *>(b), (e - b) * sizeof(T));
        this->size += (e - b);
    }